

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::debug_logger<true>::log<int,int,double,double>
          (debug_logger<true> *this,string_view fmt,int *args,int *args_1,double *args_2,
          double *args_3)

{
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_str = fmt._M_str;
  local_10._M_len = fmt._M_len;
  ::fmt::v7::
  print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,double_const&,double_const&,char>
            (this->ofs,&local_10,args,args_1,args_2,args_3);
  return;
}

Assistant:

void log([[maybe_unused]] const std::string_view fmt,
             [[maybe_unused]] const Args&... args) const noexcept
    {
        if constexpr (debug) {
            fmt::print(ofs, fmt, args...);
        }
    }